

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlockingQueue.h
# Opt level: O2

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
clog::
BlockingQueue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
take(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__,
    BlockingQueue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    *this)

{
  _Elt_pointer pbVar1;
  unique_lock<std::mutex> lock;
  
  std::unique_lock<std::mutex>::unique_lock(&lock,&this->_mutex);
  std::condition_variable::wait<clog::BlockingQueue<std::__cxx11::string>::take()::_lambda()_1_>
            (&this->_notEmpty,&lock,(anon_class_8_1_8991fb9c)this);
  pbVar1 = (this->_queue).
           super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Deque_impl_data._M_start._M_cur;
  if ((this->_queue).
      super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Deque_impl_data._M_finish._M_cur != pbVar1) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)pbVar1);
    std::
    deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::pop_front(&this->_queue);
    std::unique_lock<std::mutex>::~unique_lock(&lock);
    return __return_storage_ptr__;
  }
  __assert_fail("!_queue.empty()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/bigYellowDuck[P]clog/BlockingQueue.h"
                ,0x37,
                "T clog::BlockingQueue<std::basic_string<char>>::take() [T = std::basic_string<char>]"
               );
}

Assistant:

T take()
    {
        std::unique_lock<std::mutex> lock(_mutex);
        _notEmpty.wait(lock, [this]{ return !this->_queue.empty(); });
        
        assert(!_queue.empty());
        T front(std::move(_queue.front()));
        _queue.pop_front();
    
        return front;
    }